

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O2

bool woff2::StoreGlyph(Glyph *glyph,uint8_t *dst,size_t *dst_size)

{
  ushort uVar1;
  int iVar2;
  pointer pvVar3;
  pointer pPVar4;
  int iVar5;
  ulong uVar6;
  vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_> *contour_1;
  long lVar7;
  pointer pvVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  pointer pPVar12;
  int iVar13;
  Point *point;
  uint8_t uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  size_t local_38;
  
  if ((ulong)glyph->composite_data_size == 0) {
    pvVar8 = (glyph->contours).
             super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (glyph->contours).
             super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)pvVar8 - (long)pvVar3) / 0x18;
    if (pvVar8 == pvVar3) {
      sVar9 = 0;
    }
    else {
      if ((0x7fff < uVar6) || (*dst_size < (ulong)glyph->instructions_size + uVar6 * 2 + 0xc)) {
LAB_0010c4c2:
        iVar5 = 0;
        goto LAB_0010c4cd;
      }
      *(ushort *)dst = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
      local_38 = 2;
      anon_unknown_6::StoreBbox(glyph,&local_38,dst);
      pvVar3 = (glyph->contours).
               super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = -1;
      sVar9 = local_38;
      for (pvVar8 = (glyph->contours).
                    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; sVar18 = sVar9 + 2, pvVar8 != pvVar3;
          pvVar8 = pvVar8 + 1) {
        uVar6 = ((long)(pvVar8->
                       super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar8->
                      super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>)
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc;
        iVar5 = 0;
        if ((0xffff < uVar6) || (lVar7 = uVar6 + (long)(int)lVar7, iVar5 = 0, 0xffff < (int)lVar7))
        goto LAB_0010c4cd;
        *(ushort *)(dst + sVar9) = (ushort)lVar7 << 8 | (ushort)lVar7 >> 8;
        sVar9 = sVar18;
      }
      *(uint16_t *)(dst + sVar9) = glyph->instructions_size << 8 | glyph->instructions_size >> 8;
      uVar1 = glyph->instructions_size;
      memcpy(dst + sVar18,glyph->instructions_data,(ulong)uVar1);
      uVar17 = uVar1 + sVar18;
      uVar6 = *dst_size;
      pvVar3 = (glyph->contours).
               super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar15 = 0xffffffff;
      lVar7 = 0;
      lVar10 = 0;
      iVar13 = 0;
      iVar11 = 0;
      iVar5 = 0;
      for (pvVar8 = (glyph->contours).
                    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar3; pvVar8 = pvVar8 + 1
          ) {
        pPVar4 = (pvVar8->
                 super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar12 = (pvVar8->
                       super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                       )._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar4;
            pPVar12 = pPVar12 + 1) {
          uVar16 = (uint)pPVar12->on_curve;
          iVar11 = pPVar12->x - iVar11;
          if (iVar11 == 0) {
            uVar16 = uVar16 | 0x10;
          }
          else if (iVar11 + 0xffU < 0x1ff) {
            uVar16 = uVar16 + (uint)(0 < iVar11) * 0x10 + 2;
            lVar10 = lVar10 + 1;
          }
          else {
            lVar10 = lVar10 + 2;
          }
          if (pPVar12->y == iVar13) {
            uVar16 = uVar16 | 0x20;
          }
          else {
            iVar13 = pPVar12->y - iVar13;
            if (iVar13 + 0xffU < 0x1ff) {
              uVar16 = (uint)(0 < iVar13) << 5 | uVar16 | 4;
              lVar7 = lVar7 + 1;
            }
            else {
              lVar7 = lVar7 + 2;
            }
          }
          if (iVar5 == 0xff || uVar16 != uVar15) {
            if (iVar5 != 0) {
              if (uVar6 <= uVar17) goto LAB_0010c4c2;
              dst[uVar17] = (uint8_t)iVar5;
              uVar17 = uVar17 + 1;
            }
            iVar5 = 0;
            if (uVar6 <= uVar17) goto LAB_0010c4cd;
            dst[uVar17] = (uint8_t)uVar16;
            uVar17 = uVar17 + 1;
          }
          else {
            dst[uVar17 - 1] = dst[uVar17 - 1] | 8;
            iVar5 = iVar5 + 1;
          }
          iVar11 = pPVar12->x;
          iVar13 = pPVar12->y;
          uVar15 = uVar16;
        }
      }
      if (iVar5 != 0) {
        if (uVar6 <= uVar17) goto LAB_0010c4c2;
        dst[uVar17] = (uint8_t)iVar5;
        uVar17 = uVar17 + 1;
      }
      sVar9 = lVar10 + uVar17;
      iVar11 = 0;
      iVar5 = 0;
      if (uVar6 < lVar7 + sVar9) goto LAB_0010c4cd;
      pvVar3 = (glyph->contours).
               super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar13 = 0;
      for (pvVar8 = (glyph->contours).
                    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar3; pvVar8 = pvVar8 + 1
          ) {
        pPVar4 = (pvVar8->
                 super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar12 = (pvVar8->
                       super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                       )._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar4;
            pPVar12 = pPVar12 + 1) {
          iVar5 = pPVar12->x;
          iVar2 = pPVar12->y;
          iVar13 = iVar5 - iVar13;
          if (iVar13 != 0) {
            if (iVar13 + 0xffU < 0x1ff) {
              uVar14 = -(uint8_t)iVar13;
              if (0 < iVar13) {
                uVar14 = (uint8_t)iVar13;
              }
              dst[uVar17] = uVar14;
              uVar17 = uVar17 + 1;
            }
            else {
              *(ushort *)(dst + uVar17) = (ushort)iVar13 << 8 | (ushort)iVar13 >> 8;
              uVar17 = uVar17 + 2;
            }
          }
          if (iVar2 != iVar11) {
            iVar11 = iVar2 - iVar11;
            if (iVar11 + 0xffU < 0x1ff) {
              uVar14 = -(uint8_t)iVar11;
              if (0 < iVar11) {
                uVar14 = (uint8_t)iVar11;
              }
              dst[sVar9] = uVar14;
              sVar9 = sVar9 + 1;
            }
            else {
              *(ushort *)(dst + sVar9) = (ushort)iVar11 << 8 | (ushort)iVar11 >> 8;
              sVar9 = sVar9 + 2;
            }
          }
          iVar11 = iVar2;
          iVar13 = iVar5;
        }
      }
    }
  }
  else {
    if (*dst_size <
        (ulong)glyph->composite_data_size + (ulong)glyph->instructions_size +
        (ulong)glyph->have_instructions * 2 + 10) goto LAB_0010c4c2;
    dst[0] = 0xff;
    dst[1] = 0xff;
    local_38 = 2;
    anon_unknown_6::StoreBbox(glyph,&local_38,dst);
    sVar9 = local_38;
    uVar15 = glyph->composite_data_size;
    memcpy(dst + local_38,glyph->composite_data,(ulong)uVar15);
    sVar9 = sVar9 + uVar15;
    if (glyph->have_instructions == true) {
      *(uint16_t *)(dst + sVar9) = glyph->instructions_size << 8 | glyph->instructions_size >> 8;
      uVar1 = glyph->instructions_size;
      memcpy((ushort *)((long)(dst + sVar9) + 2),glyph->instructions_data,(ulong)uVar1);
      sVar9 = sVar9 + uVar1 + 2;
    }
  }
  *dst_size = sVar9;
  iVar5 = 1;
LAB_0010c4cd:
  return SUB41(iVar5,0);
}

Assistant:

bool StoreGlyph(const Glyph& glyph, uint8_t* dst, size_t* dst_size) {
  size_t offset = 0;
  if (glyph.composite_data_size > 0) {
    // Composite glyph.
    if (*dst_size < ((10ULL + glyph.composite_data_size) +
                     ((glyph.have_instructions ? 2ULL : 0) +
                      glyph.instructions_size))) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(-1, &offset, dst);
    StoreBbox(glyph, &offset, dst);
    StoreBytes(glyph.composite_data, glyph.composite_data_size, &offset, dst);
    if (glyph.have_instructions) {
      StoreInstructions(glyph, &offset, dst);
    }
  } else if (glyph.contours.size() > 0) {
    // Simple glyph.
    if (glyph.contours.size() > std::numeric_limits<int16_t>::max()) {
      return FONT_COMPRESSION_FAILURE();
    }
    if (*dst_size < ((12ULL + 2 * glyph.contours.size()) +
                     glyph.instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(glyph.contours.size(), &offset, dst);
    StoreBbox(glyph, &offset, dst);
    if (!StoreEndPtsOfContours(glyph, &offset, dst)) {
      return FONT_COMPRESSION_FAILURE();
    }
    StoreInstructions(glyph, &offset, dst);
    if (!StorePoints(glyph, &offset, dst, *dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
  }
  *dst_size = offset;
  return true;
}